

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyTypeUrl
          (ParserImpl *this,string *full_type_name,string *prefix)

{
  bool bVar1;
  string url;
  string local_b8;
  string *local_98;
  AlphaNum local_90;
  AlphaNum local_60;
  
  bVar1 = ConsumeIdentifier(this,prefix);
  if (bVar1) {
    local_98 = full_type_name;
    while( true ) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,".",(allocator<char> *)&local_60);
      bVar1 = TryConsume(this,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (!bVar1) break;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      bVar1 = ConsumeIdentifier(this,&local_b8);
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&local_b8);
        return false;
      }
      local_90.piece_ = absl::lts_20250127::NullSafeStringView(".");
      local_60.piece_._M_len = local_b8._M_string_length;
      local_60.piece_._M_str = local_b8._M_dataplus._M_p;
      absl::lts_20250127::StrAppend(prefix,&local_90,&local_60);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"/",(allocator<char> *)&local_60);
    bVar1 = Consume(this,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (bVar1) {
      local_90.piece_ = absl::lts_20250127::NullSafeStringView("/");
      absl::lts_20250127::StrAppend(prefix,&local_90);
      bVar1 = ConsumeFullTypeName(this,local_98);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ConsumeAnyTypeUrl(std::string* full_type_name, std::string* prefix) {
    // TODO Extend Consume() to consume multiple tokens at once, so that
    // this code can be written as just DO(Consume(kGoogleApisTypePrefix)).
    DO(ConsumeIdentifier(prefix));
    while (TryConsume(".")) {
      std::string url;
      DO(ConsumeIdentifier(&url));
      absl::StrAppend(prefix, ".", url);
    }
    DO(Consume("/"));
    absl::StrAppend(prefix, "/");
    DO(ConsumeFullTypeName(full_type_name));

    return true;
  }